

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O0

GregorianCalendar * __thiscall
icu_63::GregorianCalendar::operator=(GregorianCalendar *this,GregorianCalendar *right)

{
  GregorianCalendar *right_local;
  GregorianCalendar *this_local;
  
  if (this != right) {
    Calendar::operator=(&this->super_Calendar,&right->super_Calendar);
    this->fGregorianCutover = right->fGregorianCutover;
    this->fNormalizedGregorianCutover = right->fNormalizedGregorianCutover;
    this->fGregorianCutoverYear = right->fGregorianCutoverYear;
    this->fCutoverJulianDay = right->fCutoverJulianDay;
  }
  return this;
}

Assistant:

GregorianCalendar &
GregorianCalendar::operator=(const GregorianCalendar &right)
{
    if (this != &right)
    {
        Calendar::operator=(right);
        fGregorianCutover = right.fGregorianCutover;
        fNormalizedGregorianCutover = right.fNormalizedGregorianCutover;
        fGregorianCutoverYear = right.fGregorianCutoverYear;
        fCutoverJulianDay = right.fCutoverJulianDay;
    }
    return *this;
}